

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O3

string * rcg::anon_unknown_1::storeImagePNG
                   (string *__return_storage_ptr__,string *name,Image *image,size_t yoffset,
                   size_t height)

{
  pointer pcVar1;
  bool bVar2;
  uchar *puVar3;
  string *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  FILE *pFVar8;
  png_structp ppVar9;
  png_infop ppVar10;
  __jmp_buf_tag *p_Var11;
  string *extraout_RAX;
  long *plVar12;
  undefined8 *puVar13;
  IOException *pIVar14;
  long lVar15;
  uint8_t *row;
  uint64_t uVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  size_t sVar19;
  ulong uVar20;
  png_structp png;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  size_t local_120;
  uint64_t local_118;
  size_t local_110;
  uchar *local_108;
  png_infop local_100;
  uint8_t *local_f8;
  png_infop info;
  png_info local_e0 [16];
  png_structp local_d0;
  long local_c8;
  FILE *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_108 = (image->pixel)._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar20 = image->height;
  if (height == 0) {
    height = uVar20;
  }
  if (uVar20 < yoffset) {
    yoffset = uVar20;
  }
  uVar6 = uVar20 - yoffset;
  if (height <= uVar20 - yoffset) {
    uVar6 = height;
  }
  uVar20 = image->width;
  local_110 = image->xpadding;
  local_118 = image->pixelformat;
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_120 = uVar6;
  if ((long)local_118 < 0x20c005a) {
    if ((long)local_118 < 0x1100007) {
      if ((local_118 == 0x1080001) || (local_118 == 0x10800c6)) {
LAB_001251ed:
        pcVar1 = (name->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_50);
        sVar19 = local_120;
        ensureNewFileName((string *)&png,&local_50);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)png != &local_130) {
          operator_delete(png);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pFVar8 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
        if (pFVar8 != (FILE *)0x0) {
          ppVar9 = (png_structp)png_create_write_struct("1.6.37",0,0);
          png = ppVar9;
          ppVar10 = (png_infop)png_create_info_struct(ppVar9);
          info = ppVar10;
          p_Var11 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar9,longjmp,200);
          _setjmp(p_Var11);
          png_init_io(ppVar9,pFVar8);
          png_set_IHDR(ppVar9,ppVar10,uVar20 & 0xffffffff,sVar19 & 0xffffffff,8,0,0,0,0);
          png_write_info(ppVar9,ppVar10);
          if (sVar19 != 0) {
            lVar15 = local_110 + uVar20;
            puVar3 = local_108 + yoffset * lVar15;
            do {
              png_write_row(ppVar9,puVar3);
              puVar3 = puVar3 + lVar15;
              sVar19 = sVar19 - 1;
            } while (sVar19 != 0);
          }
          png_write_end(ppVar9,ppVar10);
          fclose(pFVar8);
          psVar4 = (string *)png_destroy_write_struct(&png,&info);
          return psVar4;
        }
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        pIVar14 = (IOException *)operator_new(0x28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                       "Cannot store file: ",__return_storage_ptr__);
        IOException::IOException(pIVar14,(string *)&png);
        *puVar13 = pIVar14;
        __cxa_throw(puVar13,&(anonymous_namespace)::IOException*::typeinfo,0);
      }
    }
    else if ((local_118 == 0x1100007) || (local_118 == 0x11000b8)) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)&local_70);
      ensureNewFileName((string *)&png,&local_70);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)png != &local_130) {
        operator_delete(png);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pFVar8 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
      if (pFVar8 != (FILE *)0x0) {
        ppVar9 = (png_structp)png_create_write_struct("1.6.37",0,0);
        png = ppVar9;
        ppVar10 = (png_infop)png_create_info_struct(ppVar9);
        info = ppVar10;
        p_Var11 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar9,longjmp,200);
        _setjmp(p_Var11);
        png_init_io(ppVar9,pFVar8);
        png_set_IHDR(ppVar9,ppVar10,uVar20 & 0xffffffff,local_120 & 0xffffffff,0x10,0,0,0,0);
        png_write_info(ppVar9,ppVar10);
        if (image->bigendian == false) {
          png_set_swap(ppVar9);
        }
        if (local_120 != 0) {
          lVar15 = local_110 + uVar20 * 2;
          puVar3 = local_108 + yoffset * lVar15;
          sVar19 = local_120;
          do {
            png_write_row(ppVar9,puVar3);
            puVar3 = puVar3 + lVar15;
            sVar19 = sVar19 - 1;
          } while (sVar19 != 0);
        }
        png_write_end(ppVar9,ppVar10);
        fclose(pFVar8);
        psVar4 = (string *)png_destroy_write_struct(&png,&info);
        return psVar4;
      }
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      pIVar14 = (IOException *)operator_new(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     "Cannot store file: ",__return_storage_ptr__);
      IOException::IOException(pIVar14,(string *)&png);
      *puVar13 = pIVar14;
      __cxa_throw(puVar13,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
  }
  else if ((long)local_118 < 0x210003b) {
    if ((local_118 == 0x20c005a) || (local_118 == 0x2100032)) {
LAB_00125372:
      pcVar1 = (name->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)&local_90);
      sVar19 = local_120;
      ensureNewFileName((string *)&png,&local_90);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)png != &local_130) {
        operator_delete(png);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pFVar8 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
      uVar16 = local_118;
      if (pFVar8 != (FILE *)0x0) {
        ppVar9 = (png_structp)png_create_write_struct("1.6.37",0,0);
        png = ppVar9;
        local_100 = (png_infop)png_create_info_struct(ppVar9);
        info = local_100;
        p_Var11 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar9,longjmp,200);
        _setjmp(p_Var11);
        png_init_io(ppVar9,pFVar8);
        png_set_IHDR(ppVar9,local_100,uVar20 & 0xffffffff,sVar19 & 0xffffffff,8,2,0,0,0);
        png_write_info(ppVar9,local_100);
        puVar18 = (uint8_t *)operator_new__(uVar20 * 3);
        if (uVar16 == 0x20c005a) {
          uVar6 = (uVar20 >> 1 & 0xfffffffffffffffe) * 3;
        }
        else {
          uVar6 = uVar20 * 2 & 0xfffffffffffffff8;
        }
        local_d0 = ppVar9;
        local_c0 = pFVar8;
        if (sVar19 != 0) {
          local_c8 = uVar6 + local_110;
          row = local_108 + yoffset * local_c8;
          uVar6 = 0;
          do {
            if (uVar16 == 0x20c005a) {
              if (uVar20 != 0) {
                uVar5 = 0;
                puVar17 = puVar18;
                do {
                  convYCbCr411toQuadRGB(puVar17,row,(int)uVar5);
                  uVar5 = uVar5 + 4;
                  puVar17 = puVar17 + 0xc;
                } while (uVar5 < uVar20);
              }
            }
            else if (uVar20 != 0) {
              uVar5 = 0;
              puVar17 = puVar18;
              do {
                convYCbCr422toQuadRGB(puVar17,row,(int)uVar5);
                uVar5 = uVar5 + 4;
                puVar17 = puVar17 + 0xc;
              } while (uVar5 < uVar20);
            }
            png_write_row(local_d0,puVar18);
            row = row + local_c8;
            uVar6 = uVar6 + 1;
            uVar16 = local_118;
          } while (uVar6 != local_120);
        }
        png_write_end(local_d0,local_100);
        fclose(local_c0);
        psVar4 = (string *)png_destroy_write_struct(&png,&info);
        return psVar4;
      }
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      pIVar14 = (IOException *)operator_new(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     "Cannot store file: ",__return_storage_ptr__);
      IOException::IOException(pIVar14,(string *)&png);
      *puVar13 = pIVar14;
      __cxa_throw(puVar13,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
  }
  else {
    if (local_118 == 0x210003b) goto LAB_00125372;
    if (local_118 == 0x81080001) goto LAB_001251ed;
  }
  uVar5 = uVar20 * 3;
  local_f8 = (uint8_t *)operator_new__(uVar6 * uVar5);
  uVar7 = uVar20;
  if (local_118 == 0x2180014) {
    uVar7 = uVar5;
  }
  bVar2 = convertImage(local_f8,(uint8_t *)0x0,local_108 + (uVar7 + local_110) * yoffset,local_118,
                       uVar20,uVar6,local_110);
  if (bVar2) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + name->_M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    ensureNewFileName((string *)&png,&local_b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)png != &local_130) {
      operator_delete(png);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pFVar8 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
    if (pFVar8 != (FILE *)0x0) {
      ppVar9 = (png_structp)png_create_write_struct("1.6.37",0,0);
      png = ppVar9;
      ppVar10 = (png_infop)png_create_info_struct(ppVar9);
      info = ppVar10;
      p_Var11 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar9,longjmp,200);
      _setjmp(p_Var11);
      png_init_io(ppVar9,pFVar8);
      png_set_IHDR(ppVar9,ppVar10,uVar20 & 0xffffffff,local_120 & 0xffffffff,8,2,0,0,0);
      png_write_info(ppVar9,ppVar10);
      puVar18 = local_f8;
      for (uVar20 = local_120; uVar20 != 0; uVar20 = uVar20 - 1) {
        png_write_row(ppVar9,puVar18);
        puVar18 = puVar18 + uVar5;
      }
      png_write_end(ppVar9,ppVar10);
      fclose(pFVar8);
      png_destroy_write_struct(&png,&info);
      operator_delete__(local_f8);
      return extraout_RAX;
    }
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    pIVar14 = (IOException *)operator_new(0x28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                   "Cannot store file: ",__return_storage_ptr__);
    IOException::IOException(pIVar14,(string *)&png);
    *puVar13 = pIVar14;
    __cxa_throw(puVar13,&(anonymous_namespace)::IOException*::typeinfo,0);
  }
  pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
  info = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&info,"storeImage(): Unsupported pixel format: ","");
  GetPixelFormatName((PfncFormat)image->pixelformat);
  plVar12 = (long *)std::__cxx11::string::append((char *)&info);
  png = (png_structp)*plVar12;
  ppVar9 = (png_structp)(plVar12 + 2);
  if (png == ppVar9) {
    local_130._M_allocated_capacity = *(undefined8 *)ppVar9;
    local_130._8_8_ = plVar12[3];
    png = (png_structp)&local_130;
  }
  else {
    local_130._M_allocated_capacity = *(undefined8 *)ppVar9;
  }
  local_138 = plVar12[1];
  *plVar12 = (long)ppVar9;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  IOException::IOException(pIVar14,(string *)&png);
  __cxa_throw(pIVar14,&(anonymous_namespace)::IOException::typeinfo,IOException::~IOException);
}

Assistant:

std::string storeImagePNG(const std::string &name, const Image &image, size_t yoffset,
  size_t height)
{
  size_t width=image.getWidth();
  size_t real_height=image.getHeight();

  if (height == 0) height=real_height;

  yoffset=std::min(yoffset, real_height);
  height=std::min(height, real_height-yoffset);

  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels());

  size_t px=image.getXPadding();

  uint64_t format=image.getPixelFormat();
  std::string full_name;

  switch (format)
  {
    case Mono8: // store 8 bit monochrome image
    case Confidence8:
    case Error8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        p+=(width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case Mono16:
    case Coord3D_C16: // store 16 bit monochrome image
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 16, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        if (!image.isBigEndian())
        {
          png_set_swap(png);
        }

        p+=(2*width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=2*width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case YCbCr411_8: // convert and store as color image
    case YCbCr422_8:
    case YUV422_8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        uint8_t *tmp=new uint8_t [3*width];

        size_t pstep;
        if (format == YCbCr411_8)
        {
          pstep=(width>>2)*6+px;
        }
        else
        {
          pstep=(width>>2)*8+px;
        }

        p+=pstep*yoffset;
        for (size_t k=0; k<height; k++)
        {
          if (format == YCbCr411_8)
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr411toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }
          else
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr422toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }

          png_write_row(png, tmp);
          p+=pstep;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    default: // try to store as color image
      {
        std::unique_ptr<uint8_t []> rgb_pixel(new uint8_t [3*width*height]);

        if (format == RGB8)
        {
          p+=(3*width+px)*yoffset;
        }
        else
        {
          p+=(width+px)*yoffset;
        }

        if (convertImage(rgb_pixel.get(), 0, p, format, width, height, px))
        {
          p=rgb_pixel.get();

          // open file and init

          full_name=ensureNewFileName(name+".png");
          FILE *out=fopen(full_name.c_str(), "wb");

          if (!out)
          {
            throw new IOException("Cannot store file: "+full_name);
          }

          png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
          png_infop info=png_create_info_struct(png);
          setjmp(png_jmpbuf(png));

          // write header

          png_init_io(png, out);
          png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
            PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
            PNG_FILTER_TYPE_DEFAULT);
          png_write_info(png, info);

          // write image body

          for (size_t k=0; k<height; k++)
          {
            png_write_row(png, const_cast<png_bytep>(p));
            p+=3*width;
          }

          // close file

          png_write_end(png, info);
          fclose(out);
          png_destroy_write_struct(&png, &info);
        }
        else
        {
          throw IOException(std::string("storeImage(): Unsupported pixel format: ")+
            GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
        }
      }
      break;
  }

  return full_name;
}